

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack_trace_table_test.cc
# Opt level: O3

void __thiscall StackTraceTableTest_Basic_Test::TestBody(StackTraceTableTest_Basic_Test *this)

{
  Entry *pEVar1;
  __uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  local_20;
  _Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false> local_18;
  StackTraceTableTestHelper h;
  
  local_18._M_head_impl = (Entry *)0x0;
  StackTraceTableTestHelper::CheckTracesAndReset
            ((StackTraceTableTestHelper *)&local_18,TestBody::k1,1);
  pEVar1 = (Entry *)operator_new(0x110);
  (pEVar1->trace).size = 0x400;
  (pEVar1->trace).depth = 2;
  (pEVar1->trace).stack[0] = (void *)0x1;
  (pEVar1->trace).stack[1] = (void *)0x2;
  (pEVar1->next)._M_t.
  super___uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  ._M_t.
  super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false> =
       (_Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>)local_18._M_head_impl;
  local_20._M_t.
  super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>._M_head_impl =
       (tuple<StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
        )(_Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
          )0x0;
  local_18._M_head_impl = pEVar1;
  std::
  unique_ptr<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  ::~unique_ptr((unique_ptr<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
                 *)&local_20);
  StackTraceTableTestHelper::CheckTracesAndReset
            ((StackTraceTableTestHelper *)&local_18,TestBody::k2,6);
  pEVar1 = (Entry *)operator_new(0x110);
  (pEVar1->trace).size = 0x400;
  (pEVar1->trace).depth = 2;
  (pEVar1->trace).stack[0] = (void *)0x1;
  (pEVar1->trace).stack[1] = (void *)0x2;
  (pEVar1->next)._M_t.
  super___uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  ._M_t.
  super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false> =
       (_Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>)local_18._M_head_impl;
  local_20._M_t.
  super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>._M_head_impl =
       (tuple<StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
        )(_Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
          )0x0;
  local_18._M_head_impl = pEVar1;
  std::
  unique_ptr<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  ::~unique_ptr((unique_ptr<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
                 *)&local_20);
  pEVar1 = (Entry *)operator_new(0x110);
  (pEVar1->trace).size = 0x200;
  (pEVar1->trace).depth = 2;
  (pEVar1->trace).stack[0] = (void *)0x2;
  (pEVar1->trace).stack[1] = (void *)0x1;
  (pEVar1->next)._M_t.
  super___uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  ._M_t.
  super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false> =
       (_Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>)local_18._M_head_impl;
  local_20._M_t.
  super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>._M_head_impl =
       (tuple<StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
        )(_Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
          )0x0;
  local_18._M_head_impl = pEVar1;
  std::
  unique_ptr<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  ::~unique_ptr((unique_ptr<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
                 *)&local_20);
  StackTraceTableTestHelper::CheckTracesAndReset
            ((StackTraceTableTestHelper *)&local_18,TestBody::k3,0xb);
  pEVar1 = (Entry *)operator_new(0x110);
  (pEVar1->trace).size = 0x400;
  (pEVar1->trace).depth = 2;
  (pEVar1->trace).stack[0] = (void *)0x1;
  (pEVar1->trace).stack[1] = (void *)0x2;
  (pEVar1->next)._M_t.
  super___uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  ._M_t.
  super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false> =
       (_Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>)local_18._M_head_impl;
  local_20._M_t.
  super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>._M_head_impl =
       (tuple<StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
        )(_Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
          )0x0;
  local_18._M_head_impl = pEVar1;
  std::
  unique_ptr<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  ::~unique_ptr((unique_ptr<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
                 *)&local_20);
  pEVar1 = (Entry *)operator_new(0x110);
  (pEVar1->trace).size = 2;
  (pEVar1->trace).depth = 2;
  (pEVar1->trace).stack[0] = (void *)0x1;
  (pEVar1->trace).stack[1] = (void *)0x2;
  (pEVar1->next)._M_t.
  super___uniq_ptr_impl<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  ._M_t.
  super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false> =
       (_Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>)local_18._M_head_impl;
  local_20._M_t.
  super__Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  .super__Head_base<0UL,_StackTraceTableTestHelper::Entry_*,_false>._M_head_impl =
       (tuple<StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
        )(_Tuple_impl<0UL,_StackTraceTableTestHelper::Entry_*,_std::default_delete<StackTraceTableTestHelper::Entry>_>
          )0x0;
  local_18._M_head_impl = pEVar1;
  std::
  unique_ptr<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  ::~unique_ptr((unique_ptr<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
                 *)&local_20);
  StackTraceTableTestHelper::CheckTracesAndReset
            ((StackTraceTableTestHelper *)&local_18,TestBody::k5,0xb);
  std::
  unique_ptr<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
  ::~unique_ptr((unique_ptr<StackTraceTableTestHelper::Entry,_std::default_delete<StackTraceTableTestHelper::Entry>_>
                 *)&local_18);
  return;
}

Assistant:

TEST(StackTraceTableTest, Basic) {
  StackTraceTableTestHelper h;

  // Empty table
  static const uintptr_t k1[] = {0};
  h.CheckTracesAndReset(k1, arraysize(k1));

  tcmalloc::StackTrace t1;
  t1.size = static_cast<uintptr_t>(1024);
  t1.depth = static_cast<uintptr_t>(2);
  t1.stack[0] = reinterpret_cast<void*>(1);
  t1.stack[1] = reinterpret_cast<void*>(2);

  tcmalloc::StackTrace t2;
  t2.size = static_cast<uintptr_t>(512);
  t2.depth = static_cast<uintptr_t>(2);
  t2.stack[0] = reinterpret_cast<void*>(2);
  t2.stack[1] = reinterpret_cast<void*>(1);

  // Table w/ just t1
  h.AddTrace(t1);
  static const uintptr_t k2[] = {1, 1024, 2, 1, 2, 0};
  h.CheckTracesAndReset(k2, arraysize(k2));

  // Table w/ t1, t2
  h.AddTrace(t1);
  h.AddTrace(t2);
  static const uintptr_t k3[] = {1, 512, 2, 2, 1, 1, 1024, 2, 1, 2, 0};
  h.CheckTracesAndReset(k3, arraysize(k3));

  // Table w/ t1, t3
  // Same stack as t1, but w/ different size
  tcmalloc::StackTrace t3;
  t3.size = static_cast<uintptr_t>(2);
  t3.depth = static_cast<uintptr_t>(2);
  t3.stack[0] = reinterpret_cast<void*>(1);
  t3.stack[1] = reinterpret_cast<void*>(2);

  h.AddTrace(t1);
  h.AddTrace(t3);
  static const uintptr_t k5[] = {1, 2, 2, 1, 2, 1, 1024, 2, 1, 2, 0};
  h.CheckTracesAndReset(k5, arraysize(k5));
}